

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

void free_truecolor_image_data(gdImagePtr oim)

{
  int local_14;
  int i;
  gdImagePtr oim_local;
  
  oim->trueColor = 0;
  for (local_14 = 0; local_14 < oim->sy; local_14 = local_14 + 1) {
    gdFree(oim->tpixels[local_14]);
  }
  gdFree(oim->tpixels);
  oim->tpixels = (int **)0x0;
  return;
}

Assistant:

static void free_truecolor_image_data(gdImagePtr oim)
{
	int i;
	oim->trueColor = 0;
	/* Junk the truecolor pixels */
	for (i = 0; i < oim->sy; i++) {
		gdFree (oim->tpixels[i]);
	}
	gdFree (oim->tpixels);
	oim->tpixels = 0;
}